

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mttlo_mipsel(CPUMIPSState_conflict2 *env,target_ulong_conflict arg1,uint32_t sel)

{
  CPUMIPSState_conflict2 *pCVar1;
  CPUMIPSState_conflict2 *other;
  uint local_18;
  int other_tc;
  uint32_t sel_local;
  target_ulong_conflict arg1_local;
  CPUMIPSState_conflict2 *env_local;
  
  other._4_4_ = env->CP0_VPEControl & 0xff;
  local_18 = sel;
  other_tc = arg1;
  _sel_local = env;
  pCVar1 = mips_cpu_map_tc(env,(int *)((long)&other + 4));
  if (other._4_4_ == pCVar1->current_tc) {
    (pCVar1->active_tc).LO[local_18] = other_tc;
  }
  else {
    pCVar1->tcs[(int)other._4_4_].LO[local_18] = other_tc;
  }
  return;
}

Assistant:

void helper_mttlo(CPUMIPSState *env, target_ulong arg1, uint32_t sel)
{
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    CPUMIPSState *other = mips_cpu_map_tc(env, &other_tc);

    if (other_tc == other->current_tc) {
        other->active_tc.LO[sel] = arg1;
    } else {
        other->tcs[other_tc].LO[sel] = arg1;
    }
}